

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::q15MulrSatSI16x8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *this_00;
  Literal *val;
  Literal *this_01;
  long lVar1;
  undefined1 local_1e0 [8];
  LaneArray<8> other_lanes;
  LaneArray<8> lanes;
  Literal local_48;
  
  getLanes<short,8>((LaneArray<8> *)&other_lanes._M_elems[7].type,(wasm *)this,other);
  getLanes<short,8>((LaneArray<8> *)local_1e0,(wasm *)other,val);
  lVar1 = 0;
  this_00 = &lanes._M_elems[7].type;
  do {
    this_01 = (Literal *)((long)lanes._M_elems + lVar1 + -8);
    q15MulrSatSI16(&local_48,this_01,(Literal *)(local_1e0 + lVar1));
    Literal((Literal *)this_00,&local_48);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
    ~Literal(&local_48);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xc0);
  Literal(__return_storage_ptr__,(LaneArray<8> *)&other_lanes._M_elems[7].type);
  lVar1 = 0xa8;
  do {
    ~Literal((Literal *)(local_1e0 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0xa8;
  do {
    ~Literal((Literal *)((long)lanes._M_elems + lVar1 + -8));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::q15MulrSatSI16x8(const Literal& other) const {
  return binary<8, &Literal::getLanesSI16x8, &Literal::q15MulrSatSI16>(*this,
                                                                       other);
}